

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::LogicalType::LogicalType(LogicalType *this)

{
  *(undefined ***)this = &PTR__LogicalType_027ce4a0;
  this->STRING = (StringType)&PTR__StringType_027cdd50;
  this->MAP = (MapType)&PTR__MapType_027cde20;
  this->LIST = (ListType)&PTR__ListType_027cde88;
  this->ENUM = (EnumType)&PTR__EnumType_027cdef0;
  *(undefined ***)&this->DECIMAL = &PTR__DecimalType_027ce090;
  (this->DECIMAL).scale = 0;
  (this->DECIMAL).precision = 0;
  this->DATE = (DateType)&PTR__DateType_027cdf58;
  TimeType::TimeType(&this->TIME);
  TimestampType::TimestampType(&this->TIMESTAMP);
  *(undefined ***)&this->INTEGER = &PTR__IntType_027ce368;
  (this->INTEGER).bitWidth = '\0';
  (this->INTEGER).isSigned = false;
  this->UNKNOWN = (NullType)&PTR__NullType_027ce028;
  this->JSON = (JsonType)&PTR__JsonType_027ce3d0;
  this->BSON = (BsonType)&PTR__BsonType_027ce438;
  this->UUID = (UUIDType)&PTR__UUIDType_027cddb8;
  this->FLOAT16 = (Float16Type)&PTR__Float16Type_027cdfc0;
  this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xc000);
  return;
}

Assistant:

LogicalType::LogicalType() noexcept {
}